

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O0

void __thiscall Color::Color(Color *this,double red,double green,double blue)

{
  int local_34;
  int local_30;
  int b;
  int g;
  int r;
  double blue_local;
  double green_local;
  double red_local;
  Color *this_local;
  
  b = (int)red;
  local_30 = (int)green;
  local_34 = (int)blue;
  _g = blue;
  blue_local = green;
  green_local = red;
  red_local = (double)this;
  clamp(this,&b,&local_30,&local_34);
  this->r = (uchar)b;
  this->g = (uchar)local_30;
  this->b = (uchar)local_34;
  return;
}

Assistant:

Color::Color(double red, double green, double blue) {
    int r,g,b;
    r = red;
    g = green;
    b = blue;
    clamp(r, g, b);

    this->r = r;
    this->g = g;
    this->b = b;

}